

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::microfacet::g1(microfacet *this,vec3 *wm,vec3 *wi,args *args)

{
  float fVar1;
  float_t fVar2;
  args *args_local;
  vec3 *wi_local;
  vec3 *wm_local;
  microfacet *this_local;
  
  if (wm->z <= 0.0) {
    this_local._4_4_ = 0.0;
  }
  else {
    fVar1 = sat<float>(&wi->z);
    fVar2 = sigma(this,wi,args);
    this_local._4_4_ = fVar1 / fVar2;
  }
  return this_local._4_4_;
}

Assistant:

float_t
microfacet::g1(const vec3 &wm, const vec3 &wi, const args &args) const
{
	if (wm.z > 0)
		return sat(wi.z) / sigma(wi, args);
	return 0;
}